

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::MergeSort<long>
               (long *list,uint32 length,CompareVarsInfo *cvInfo,ArenaAllocator *allocator)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  undefined4 *puVar7;
  ulong uVar8;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  undefined8 *puVar17;
  undefined8 local_a0;
  CompareVarsInfo *local_98;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint local_64;
  char *local_60;
  ulong local_58;
  ulong local_50;
  undefined8 local_48;
  long rightElement;
  ulong local_38;
  ulong uVar9;
  
  if (length != 0) {
    uVar10 = (ulong)length;
    local_90 = cvInfo->compareType;
    rightElement = (long)list;
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00ba27e6;
      *puVar7 = 0;
    }
    local_60 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(&allocator->
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ,uVar10 << 3);
    if (local_60 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_00ba27e6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    local_64 = length * 2;
    if (2 < local_64) {
      local_50 = 1;
      uVar8 = 2;
      lVar16 = rightElement;
      local_98 = cvInfo;
      local_78 = uVar10;
      do {
        local_38 = uVar8;
        if ((int)uVar10 != 0) {
          local_80 = local_50 & 0xffffffff;
          local_58 = 0;
          do {
            uVar6 = (int)local_50 + (int)local_58;
            uVar9 = (ulong)uVar6;
            if (uVar6 < (uint)uVar10) {
              local_70 = (ulong)(uVar6 - 1);
              puVar17 = (undefined8 *)(lVar16 + local_70 * 8);
              bVar4 = (*local_90)(local_98,(void *)(lVar16 + uVar9 * 8),puVar17);
              lVar16 = rightElement;
              if (bVar4) {
                uVar11 = (int)local_58 + (int)local_38;
                if ((uint)local_78 <= uVar11) {
                  uVar11 = (uint)local_78;
                }
                uVar14 = 0xffffffff;
                if (uVar6 < uVar11) {
                  lVar16 = 0;
                  do {
                    *(undefined8 *)(local_60 + lVar16 * 8) =
                         *(undefined8 *)(rightElement + (local_80 & 0xffffffff) * 8 + lVar16 * 8);
                    lVar12 = (local_80 & 0xffffffff) + lVar16;
                    lVar16 = lVar16 + 1;
                  } while (lVar12 + 1U < (ulong)uVar11);
                  uVar9 = (ulong)(uint)((int)local_80 + (int)lVar16);
                  uVar14 = (int)lVar16 - 1;
                }
                local_48 = *(undefined8 *)(local_60 + (ulong)uVar14 * 8);
                while( true ) {
                  local_a0 = *puVar17;
                  local_88 = (ulong)uVar14;
                  iVar15 = uVar14 - 1;
                  iVar2 = (int)uVar9;
                  uVar6 = iVar2 - 3;
                  lVar12 = 0;
                  while( true ) {
                    lVar13 = local_88 + lVar12;
                    bVar4 = (*local_90)(local_98,&local_48,&local_a0);
                    iVar3 = (int)lVar12;
                    uVar10 = (ulong)((iVar2 - 1U) + iVar3);
                    uVar14 = (uint)lVar13;
                    lVar16 = rightElement;
                    if (bVar4) break;
                    *(undefined8 *)(rightElement + uVar10 * 8) = local_48;
                    if (uVar14 == 0) goto LAB_00ba27a1;
                    local_48 = *(undefined8 *)(local_60 + (ulong)(uint)(iVar15 + iVar3) * 8);
                    lVar12 = lVar12 + -1;
                    uVar6 = uVar6 - 1;
                  }
                  *(undefined8 *)(rightElement + uVar10 * 8) = local_a0;
                  if ((uint)local_70 <= (uint)local_58) break;
                  local_70 = (ulong)((uint)local_70 - 1);
                  puVar17 = (undefined8 *)(rightElement + local_70 * 8);
                  uVar9 = (ulong)(iVar2 - 1U) + lVar12 & 0xffffffff;
                }
                *(undefined8 *)(rightElement + (ulong)((iVar2 + iVar3) - 2) * 8) = local_48;
                if ((int)local_88 + iVar3 != 0) {
                  do {
                    uVar10 = (ulong)uVar6;
                    uVar6 = uVar6 - 1;
                    *(undefined8 *)(rightElement + uVar10 * 8) =
                         *(undefined8 *)(local_60 + lVar13 * 8 + -8);
                    lVar13 = lVar13 + -1;
                  } while (lVar13 != 0);
                }
              }
            }
LAB_00ba27a1:
            uVar6 = (int)local_58 + (int)local_38;
            local_58 = (ulong)uVar6;
            local_80 = local_80 + uVar8;
            uVar10 = local_78;
          } while (uVar6 < (uint)local_78);
        }
        local_50 = local_38;
        uVar6 = (int)local_38 * 2;
        uVar8 = (ulong)uVar6;
      } while (uVar6 < local_64);
    }
  }
  return;
}

Assistant:

void JavascriptArray::MergeSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo, ArenaAllocator* allocator)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        T* buffer = AnewArray(allocator, T, length);
        uint32 bucketSize = 2, lastSize = 1, position = 0, left = 0, mid = 0, right = 0, i = 0, j = 0, k = 0;
        uint32 doubleLength = length + length;
        T rightElement, leftElement;

        while (bucketSize < doubleLength)
        {
            while (position < length)
            {
                left = position;
                mid = left + lastSize;

                // perform a merge but only if it's necessary
                if (mid < length && compareType (cvInfo, &list[mid], &list[mid - 1]))
                {
                    right = position + bucketSize;
                    right = right < length ? right : length;
                    i = mid - 1, j = 0, k = mid;

                    while (k < right)
                    {
                        buffer[j++] = list[k++];
                    }
    
                    rightElement = buffer[--j];
                    leftElement = list[i];

                    for (;;)
                    {
                        if (compareType (cvInfo, &rightElement, &leftElement))
                        {
                            list[--k] = leftElement;
                            if (i > left)
                            {
                                leftElement = list[--i];
                            }
                            else
                            {
                                list[--k] = rightElement;
                                break;
                            }
                        }
                        else
                        {
                            list[--k] = rightElement;
                            if (j > 0)
                            {
                                rightElement = buffer[--j];
                            }
                            else
                            {
                                break;
                            }
                        }
                    }

                    while (j > 0)
                    {
                        list[--k] = buffer[--j];
                    }
                }  
                position += bucketSize;
            }
            position = 0;
            lastSize = bucketSize;
            bucketSize *= 2;
        }
    }